

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_string.c
# Opt level: O0

int vasprintf(char **__ptr,char *__f,__gnuc_va_list __arg)

{
  char *pcVar1;
  char local_49;
  int size;
  char tmp [1];
  va_list ap2;
  __va_list_tag *ap_local;
  char *fmt_local;
  char **strp_local;
  
  _size = *__arg;
  strp_local._4_4_ = vsnprintf(&local_49,1,__f,&size);
  if (0 < strp_local._4_4_) {
    pcVar1 = (char *)malloc((long)(strp_local._4_4_ + 1));
    *__ptr = pcVar1;
    strp_local._4_4_ = vsnprintf(*__ptr,(long)(strp_local._4_4_ + 1),__f,__arg);
  }
  return strp_local._4_4_;
}

Assistant:

int vasprintf(char ** strp, const char * fmt, va_list ap) {
	va_list ap2;
	va_copy(ap2, ap);

#if (defined(_WIN32) || defined(__WIN32__))
	char * tmp = NULL;
	int size = vsnprintf(tmp, 0, fmt, ap2);
#else
	char tmp[1];
	int size = vsnprintf(tmp, 1, fmt, ap2);
#endif

	if (size <= 0) {
		return size;
	}

	va_end(ap2);
	size += 1;
	*strp = (char *)malloc(size * sizeof(char));
	return vsnprintf(*strp, size, fmt, ap);
}